

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# screenshot.cpp
# Opt level: O1

bool polyscope::anon_unknown_5::hasExtension(string *str,string *ext)

{
  size_type sVar1;
  pointer pcVar2;
  string *psVar3;
  int iVar4;
  size_type sVar5;
  bool bVar6;
  
  sVar1 = str->_M_string_length;
  if (sVar1 != 0) {
    pcVar2 = (str->_M_dataplus)._M_p;
    sVar5 = 0;
    do {
      iVar4 = tolower((int)pcVar2[sVar5]);
      pcVar2[sVar5] = (char)iVar4;
      sVar5 = sVar5 + 1;
    } while (sVar1 != sVar5);
  }
  sVar1 = ext->_M_string_length;
  if (sVar1 != 0) {
    pcVar2 = (ext->_M_dataplus)._M_p;
    sVar5 = 0;
    do {
      iVar4 = tolower((int)pcVar2[sVar5]);
      pcVar2[sVar5] = (char)iVar4;
      sVar5 = sVar5 + 1;
    } while (sVar1 != sVar5);
  }
  psVar3 = (string *)ext->_M_string_length;
  if ((string *)str->_M_string_length < psVar3) {
    bVar6 = false;
  }
  else {
    iVar4 = std::__cxx11::string::compare
                      ((ulong)str,(long)str->_M_string_length - (long)psVar3,psVar3);
    bVar6 = iVar4 == 0;
  }
  return bVar6;
}

Assistant:

bool hasExtension(std::string str, std::string ext) {

  std::transform(str.begin(), str.end(), str.begin(), ::tolower);
  std::transform(ext.begin(), ext.end(), ext.begin(), ::tolower);

  if (str.length() >= ext.length()) {
    return (0 == str.compare(str.length() - ext.length(), ext.length(), ext));
  } else {
    return false;
  }
}